

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestLazyMessageRepeated::Clear(TestLazyMessageRepeated *this)

{
  uint32_t cached_has_bits;
  TestLazyMessageRepeated *this_local;
  
  google::protobuf::RepeatedPtrField<proto2_unittest::TestLazyMessage>::Clear
            (&(this->field_0)._impl_.repeated_message_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestLazyMessageRepeated::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestLazyMessageRepeated)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_message_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}